

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall Camera::m_init(Camera *this)

{
  int w;
  int h;
  Bmp *this_00;
  double dVar1;
  Color local_d0;
  Vector3 local_b8;
  Vector3 local_a0;
  Vector3 local_88;
  Vector3 local_70;
  Vector3 local_58;
  Vector3 local_40;
  Vector3 local_28;
  Camera *local_10;
  Camera *this_local;
  
  local_10 = this;
  dVar1 = tan(this->m_fovy);
  Vector3::operator*(&local_40,&this->m_up,dVar1);
  Vector3::operator*(&local_28,&local_40,-this->m_dist);
  (this->m_dh).z = local_28.z;
  (this->m_dh).x = local_28.x;
  (this->m_dh).y = local_28.y;
  operator*(&local_b8,&this->m_dh,&this->m_dir);
  Vector3::unitize(&local_a0,&local_b8);
  dVar1 = tan(this->m_fovy);
  Vector3::operator*(&local_88,&local_a0,dVar1);
  Vector3::operator*(&local_70,&local_88,this->m_dist);
  Vector3::operator*(&local_58,&local_70,(double)this->m_w / (double)this->m_h);
  (this->m_dw).z = local_58.z;
  (this->m_dw).x = local_58.x;
  (this->m_dw).y = local_58.y;
  this_00 = (Bmp *)operator_new(0x46);
  w = this->m_w;
  h = this->m_h;
  Color::Color(&local_d0);
  Bmp::Bmp(this_00,w,h,&local_d0);
  this->m_film = this_00;
  return;
}

Assistant:

void Camera::m_init()
{
    m_dh = m_up * tan(m_fovy) * -m_dist;
    m_dw = (m_dh * m_dir).unitize() * tan(m_fovy) * m_dist * (1.0 * m_w / m_h);
    m_film = new Bmp(m_w, m_h);
}